

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

void __thiscall ON_Viewport::Dump(ON_Viewport *this,ON_TextLog *dump)

{
  double dVar1;
  bool bVar2;
  char *pcVar3;
  double local_28;
  double port_aspect;
  double frus_aspect;
  ON_TextLog *dump_local;
  ON_Viewport *this_local;
  
  frus_aspect = (double)dump;
  dump_local = (ON_TextLog *)this;
  ON_TextLog::Print(dump,"ON_Viewport\n");
  ON_TextLog::PushIndent((ON_TextLog *)frus_aspect);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Projection: ");
  if (this->m_projection == parallel_view) {
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"parallel\n");
  }
  else if (this->m_projection == perspective_view) {
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"perspective\n");
  }
  else {
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"invalid\n");
  }
  pcVar3 = "false";
  if ((this->m_bValidCamera & 1U) != 0) {
    pcVar3 = "true";
  }
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Camera: (m_bValidCamera = %s)\n",pcVar3);
  ON_TextLog::PushIndent((ON_TextLog *)frus_aspect);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Location: ");
  bVar2 = CameraLocationIsLocked(this);
  if (bVar2) {
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"(locked) ");
  }
  ON_TextLog::Print((ON_TextLog *)frus_aspect,&this->m_CamLoc);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Direction: ");
  bVar2 = CameraDirectionIsLocked(this);
  if (bVar2) {
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"(locked) ");
  }
  ON_TextLog::Print((ON_TextLog *)frus_aspect,&this->m_CamDir);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Up: ");
  bVar2 = CameraUpIsLocked(this);
  if (bVar2) {
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"(locked) ");
  }
  ON_TextLog::Print((ON_TextLog *)frus_aspect,&this->m_CamUp);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"X: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,&this->m_CamX);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Y: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,&this->m_CamY);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Z: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,&this->m_CamZ);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::PopIndent((ON_TextLog *)frus_aspect);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Target Point: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,&this->m_target_point);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  dVar1 = frus_aspect;
  TargetDistance(this,true);
  ON_TextLog::Print((ON_TextLog *)dVar1,"target distance %g\n");
  port_aspect = 0.0;
  GetFrustumAspect(this,&port_aspect);
  pcVar3 = "false";
  if ((this->m_bValidFrustum & 1U) != 0) {
    pcVar3 = "true";
  }
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Frustum: (m_bValidFrustum = %s)\n",pcVar3);
  ON_TextLog::PushIndent((ON_TextLog *)frus_aspect);
  dVar1 = frus_aspect;
  bVar2 = FrustumIsLeftRightSymmetric(this);
  pcVar3 = "false";
  if (bVar2) {
    pcVar3 = "true";
  }
  ON_TextLog::Print((ON_TextLog *)dVar1,"left/right symmetry locked = %s\n",pcVar3);
  dVar1 = frus_aspect;
  bVar2 = FrustumIsTopBottomSymmetric(this);
  pcVar3 = "false";
  if (bVar2) {
    pcVar3 = "true";
  }
  ON_TextLog::Print((ON_TextLog *)dVar1,"top/bottom symmetry locked = %s\n",pcVar3);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"left: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,this->m_frus_left);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"right: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,this->m_frus_right);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"bottom: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,this->m_frus_bottom);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"top: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,this->m_frus_top);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"near: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,this->m_frus_near);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"far: ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,this->m_frus_far);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"aspect (width/height): ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,port_aspect);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  if (this->m_projection == perspective_view) {
    ON_TextLog::PushIndent((ON_TextLog *)frus_aspect);
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"near/far: %g\n",
                      this->m_frus_near / this->m_frus_far);
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"suggested minimum near: = %g\n",
                      this->m__MIN_NEAR_DIST);
    ON_TextLog::Print((ON_TextLog *)frus_aspect,"suggested minimum near/far: = %g\n",
                      this->m__MIN_NEAR_OVER_FAR);
    ON_TextLog::PopIndent((ON_TextLog *)frus_aspect);
  }
  ON_TextLog::PopIndent((ON_TextLog *)frus_aspect);
  local_28 = 0.0;
  GetScreenPortAspect(this,&local_28);
  pcVar3 = "false";
  if ((this->m_bValidPort & 1U) != 0) {
    pcVar3 = "true";
  }
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"Port: (m_bValidPort = %s\n",pcVar3);
  ON_TextLog::PushIndent((ON_TextLog *)frus_aspect);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"left: %d\n",(ulong)(uint)this->m_port_left);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"right: %d\n",(ulong)(uint)this->m_port_right);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"bottom: %d\n",(ulong)(uint)this->m_port_bottom);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"top: %d\n",(ulong)(uint)this->m_port_top);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"near: %d\n",(ulong)(uint)this->m_port_near);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"far: %d\n",(ulong)(uint)this->m_port_far);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"aspect (width/height): ");
  ON_TextLog::Print((ON_TextLog *)frus_aspect,local_28);
  ON_TextLog::Print((ON_TextLog *)frus_aspect,"\n");
  ON_TextLog::PopIndent((ON_TextLog *)frus_aspect);
  ON_TextLog::PopIndent((ON_TextLog *)frus_aspect);
  return;
}

Assistant:

void ON_Viewport::Dump( ON_TextLog& dump ) const
{
  dump.Print("ON_Viewport\n");
  dump.PushIndent();

  dump.Print("Projection: ");
  switch(m_projection)
  {
  case ON::parallel_view:
    dump.Print("parallel\n");
    break;
  case ON::perspective_view:
    dump.Print("perspective\n");
    break;
  default:
    dump.Print("invalid\n");
    break;
  }
  dump.Print("Camera: (m_bValidCamera = %s)\n",(m_bValidCamera?"true":"false"));
  dump.PushIndent();
  dump.Print("Location: "); if ( CameraLocationIsLocked() ) dump.Print("(locked) "); dump.Print(m_CamLoc); dump.Print("\n");
  dump.Print("Direction: "); if ( CameraDirectionIsLocked() ) dump.Print("(locked) "); dump.Print(m_CamDir); dump.Print("\n");
  dump.Print("Up: "); if ( CameraUpIsLocked() ) dump.Print("(locked) "); dump.Print(m_CamUp); dump.Print("\n");
  dump.Print("X: "); dump.Print(m_CamX); dump.Print("\n");
  dump.Print("Y: "); dump.Print(m_CamY); dump.Print("\n");
  dump.Print("Z: "); dump.Print(m_CamZ); dump.Print("\n");
  dump.PopIndent();
  dump.Print("Target Point: "); dump.Print(m_target_point); dump.Print("\n");
  dump.Print("target distance %g\n",TargetDistance(true));

  double frus_aspect=0.0;
  GetFrustumAspect(frus_aspect);
  dump.Print("Frustum: (m_bValidFrustum = %s)\n",(m_bValidFrustum?"true":"false"));
  dump.PushIndent();
  dump.Print("left/right symmetry locked = %s\n",FrustumIsLeftRightSymmetric()?"true":"false");
  dump.Print("top/bottom symmetry locked = %s\n",FrustumIsTopBottomSymmetric()?"true":"false");
  dump.Print("left: "); dump.Print(m_frus_left); dump.Print("\n");
  dump.Print("right: "); dump.Print(m_frus_right); dump.Print("\n");
  dump.Print("bottom: "); dump.Print(m_frus_bottom); dump.Print("\n");
  dump.Print("top: "); dump.Print(m_frus_top); dump.Print("\n");
  dump.Print("near: "); dump.Print(m_frus_near); dump.Print("\n");
  dump.Print("far: "); dump.Print(m_frus_far); dump.Print("\n");
  dump.Print("aspect (width/height): "); dump.Print(frus_aspect); dump.Print("\n");
  if ( ON::perspective_view == m_projection )
  {
    dump.PushIndent();
    dump.Print("near/far: %g\n",m_frus_near/m_frus_far);
    dump.Print("suggested minimum near: = %g\n",m__MIN_NEAR_DIST);
    dump.Print("suggested minimum near/far: = %g\n",m__MIN_NEAR_OVER_FAR);
    dump.PopIndent();
  }
  dump.PopIndent();

  double port_aspect=0.0;
  GetScreenPortAspect(port_aspect);
  dump.Print("Port: (m_bValidPort = %s\n",(m_bValidPort?"true":"false"));
  dump.PushIndent();
  dump.Print("left: %d\n",m_port_left);
  dump.Print("right: %d\n",m_port_right);
  dump.Print("bottom: %d\n",m_port_bottom);
  dump.Print("top: %d\n",m_port_top);
  dump.Print("near: %d\n",m_port_near);
  dump.Print("far: %d\n",m_port_far);
  dump.Print("aspect (width/height): "); dump.Print(port_aspect); dump.Print("\n");
  dump.PopIndent();

  dump.PopIndent();
}